

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntLoadConstraint_Ct
          (ChLinkMotorLinearDriveline *this,uint off_L,ChVectorDynamic<> *Qc,double c)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  
  ChLinkMateGeneric::IntLoadConstraint_Ct((ChLinkMateGeneric *)this,off_L,Qc,c);
  peVar2 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x27])(c,peVar2,(ulong)(iVar1 + off_L),Qc)
  ;
  peVar2 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x27])
            (c,peVar2,(ulong)(iVar1 + 1 + off_L),Qc);
  peVar3 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x27])
            (c,peVar3,(ulong)(iVar1 + 2 + off_L),Qc);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntLoadConstraint_Ct(const unsigned int off_L, ChVectorDynamic<>& Qc, const double c) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntLoadConstraint_Ct(off_L, Qc, c);

    int nc = mask.nconstr;
    innerconstraint1lin->IntLoadConstraint_Ct(off_L + nc + 0, Qc, c);
    innerconstraint2lin->IntLoadConstraint_Ct(off_L + nc + 1, Qc, c);
    innerconstraint2rot->IntLoadConstraint_Ct(off_L + nc + 2, Qc, c);
}